

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texture_size_invalid_lod
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  NegativeTestContext *pNVar1;
  bool bVar2;
  char *pcVar3;
  RenderContext *pRVar4;
  DataType dataType;
  DataType in_R9D;
  bool local_171;
  string local_148;
  undefined1 local_128 [8];
  string shaderSource;
  int dataTypeNdx2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  byte local_b9;
  string local_b8;
  deUint32 local_98;
  ContextType local_94;
  int local_90;
  allocator<char> local_89;
  int dataTypeNdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  int local_48;
  int shaderNdx;
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"textureSize: Invalid lod type.",&local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  for (local_48 = 0; local_48 < 6; local_48 = local_48 + 1) {
    bVar2 = NegativeTestContext::isShaderSupported
                      (local_10,*(ShaderType *)
                                 ((anonymous_namespace)::s_shaders + (long)local_48 * 4));
    pNVar1 = local_10;
    if (bVar2) {
      pcVar3 = glu::getShaderTypeName
                         (*(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&dataTypeNdx,pcVar3,&local_89);
      std::operator+(&local_68,"Verify shader: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &dataTypeNdx);
      NegativeTestContext::beginSection(pNVar1,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&dataTypeNdx);
      std::allocator<char>::~allocator(&local_89);
      for (local_90 = 0; local_90 < 0x1c; local_90 = local_90 + 1) {
        pRVar4 = NegativeTestContext::getRenderContext(local_10);
        local_94.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
        local_98 = (deUint32)glu::ApiType::es(3,2);
        bVar2 = glu::contextSupports(local_94,(ApiType)local_98);
        pNVar1 = local_10;
        local_b9 = 0;
        local_171 = true;
        if (!bVar2) {
          (anonymous_namespace)::getDataTypeExtension_abi_cxx11_
                    (&local_b8,
                     (_anonymous_namespace_ *)
                     (ulong)*(uint *)((anonymous_namespace)::s_samplerTypes + (long)local_90 * 4),
                     dataType);
          local_b9 = 1;
          local_171 = NegativeTestContext::isExtensionSupported(pNVar1,&local_b8);
        }
        if ((local_b9 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_b8);
        }
        pNVar1 = local_10;
        if (local_171 != false) {
          pcVar3 = glu::getDataTypeName
                             (*(DataType *)
                               ((anonymous_namespace)::s_samplerTypes + (long)local_90 * 4));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&dataTypeNdx2,pcVar3,
                     (allocator<char> *)(shaderSource.field_2._M_local_buf + 0xf));
          std::operator+(&local_e0,"Verify sampler/lod data type",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &dataTypeNdx2);
          NegativeTestContext::beginSection(pNVar1,&local_e0);
          std::__cxx11::string::~string((string *)&local_e0);
          std::__cxx11::string::~string((string *)&dataTypeNdx2);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(shaderSource.field_2._M_local_buf + 0xf));
          for (shaderSource.field_2._8_4_ = 0; (int)shaderSource.field_2._8_4_ < 0xb;
              shaderSource.field_2._8_4_ = shaderSource.field_2._8_4_ + 1) {
            if (*(int *)((anonymous_namespace)::s_nonScalarIntTypes +
                        (long)(int)shaderSource.field_2._8_4_ * 4) != 0x1b) {
              (anonymous_namespace)::genShaderSourceTextureSize_lod_abi_cxx11_
                        ((string *)local_128,(_anonymous_namespace_ *)local_10,
                         (NegativeTestContext *)
                         (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),
                         *(ShaderType *)((anonymous_namespace)::s_samplerTypes + (long)local_90 * 4)
                         ,*(DataType *)
                           ((anonymous_namespace)::s_nonScalarIntTypes +
                           (long)(int)shaderSource.field_2._8_4_ * 4),in_R9D);
              pNVar1 = local_10;
              shaderType = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
              std::__cxx11::string::string((string *)&local_148,(string *)local_128);
              verifyShader(pNVar1,shaderType,&local_148);
              std::__cxx11::string::~string((string *)&local_148);
              std::__cxx11::string::~string((string *)local_128);
            }
          }
          NegativeTestContext::endSection(local_10);
        }
      }
      NegativeTestContext::endSection(local_10);
    }
  }
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void texture_size_invalid_lod (NegativeTestContext& ctx)
{
	ctx.beginSection("textureSize: Invalid lod type.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_samplerTypes); ++dataTypeNdx)
			{
				if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(getDataTypeExtension(s_samplerTypes[dataTypeNdx])))
				{
					ctx.beginSection("Verify sampler/lod data type" + std::string(getDataTypeName(s_samplerTypes[dataTypeNdx])));
					for (int dataTypeNdx2 = 0; dataTypeNdx2 < DE_LENGTH_OF_ARRAY(s_nonScalarIntTypes); ++dataTypeNdx2)
					{
						if (s_nonScalarIntTypes[dataTypeNdx2] == glu::TYPE_INT)
							continue;

						const std::string shaderSource(genShaderSourceTextureSize_lod(ctx, s_shaders[shaderNdx], s_samplerTypes[dataTypeNdx], s_nonScalarIntTypes[dataTypeNdx2]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					ctx.endSection();
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}